

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall
Js::Type::Type(Type *this,ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
              JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  this->typeId = typeId;
  this->flags = TypeFlagMask_None;
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierSet
            (&this->javascriptLibrary,(scriptContext->super_ScriptContextBase).javascriptLibrary);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->prototype,prototype);
  (this->propertyCache).ptr = (TypePropertyCache *)0x0;
  if (typeId < TypeIds_Limit) {
    scriptContext->typeCount[typeId] = scriptContext->typeCount[typeId] + 1;
  }
  if (entryPoint == (JavascriptMethod)0x0) {
    entryPoint = RecyclableObject::DefaultEntryPoint;
  }
  this->entryPoint = (Type)entryPoint;
  if (prototype != (RecyclableObject *)0x0) {
    BVar3 = CrossSite::NeedMarshalVar(prototype,scriptContext);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/Type.cpp"
                                  ,0x22,"(! CrossSite::NeedMarshalVar(prototype,scriptContext))",
                                  "! CrossSite::NeedMarshalVar(prototype,scriptContext)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    RecyclableObject::SetIsPrototype(prototype);
    return;
  }
  return;
}

Assistant:

Type::Type(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint) :
        javascriptLibrary(scriptContext->GetLibrary()),
        typeId(typeId),
        prototype(prototype),
        propertyCache(nullptr),
        flags(TypeFlagMask_None)
    {
#ifdef PROFILE_TYPES
        if (typeId < sizeof(scriptContext->typeCount)/sizeof(int))
        {
            scriptContext->typeCount[typeId]++;
        }
#endif
        this->entryPoint = entryPoint != nullptr ? entryPoint : RecyclableObject::DefaultEntryPoint;
        if (prototype)
        {
            Assert(! CrossSite::NeedMarshalVar(prototype,scriptContext));
            prototype->SetIsPrototype();
        }
    }